

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

CURLcode Curl_ssl_peer_init(ssl_peer *peer,Curl_cfilter *cf,int transport)

{
  _Bool _Var1;
  int iVar2;
  ssl_peer_type sVar3;
  char *pcVar4;
  ulong local_40;
  size_t len;
  char *pcStack_30;
  CURLcode result;
  char *edispname;
  char *ehostname;
  int transport_local;
  Curl_cfilter *cf_local;
  ssl_peer *peer_local;
  
  len._4_4_ = CURLE_OUT_OF_MEMORY;
  peer->transport = transport;
  _Var1 = Curl_ssl_cf_is_proxy(cf);
  if (_Var1) {
    edispname = (cf->conn->http_proxy).host.name;
    pcStack_30 = (cf->conn->http_proxy).host.dispname;
    peer->port = (cf->conn->http_proxy).port;
  }
  else {
    edispname = (cf->conn->host).name;
    pcStack_30 = (cf->conn->host).dispname;
    peer->port = cf->conn->remote_port;
  }
  if ((edispname == (char *)0x0) || (*edispname == '\0')) {
    len._4_4_ = CURLE_FAILED_INIT;
  }
  else {
    pcVar4 = (*Curl_cstrdup)(edispname);
    peer->hostname = pcVar4;
    if (peer->hostname != (char *)0x0) {
      if ((pcStack_30 == (char *)0x0) || (iVar2 = strcmp(edispname,pcStack_30), iVar2 == 0)) {
        peer->dispname = peer->hostname;
      }
      else {
        pcVar4 = (*Curl_cstrdup)(pcStack_30);
        peer->dispname = pcVar4;
        if (peer->dispname == (char *)0x0) goto LAB_001ba5e9;
      }
      sVar3 = get_peer_type(peer->hostname);
      peer->type = sVar3;
      if (peer->type == CURL_SSL_PEER_DNS) {
        local_40 = strlen(peer->hostname);
        if ((local_40 != 0) && (peer->hostname[local_40 - 1] == '.')) {
          local_40 = local_40 - 1;
        }
        if (local_40 < 0xffff) {
          pcVar4 = (char *)(*Curl_ccalloc)(1,local_40 + 1);
          peer->sni = pcVar4;
          if (peer->sni == (char *)0x0) goto LAB_001ba5e9;
          Curl_strntolower(peer->sni,peer->hostname,local_40);
          peer->sni[local_40] = '\0';
        }
      }
      len._4_4_ = CURLE_OK;
    }
  }
LAB_001ba5e9:
  if (len._4_4_ != CURLE_OK) {
    Curl_ssl_peer_cleanup(peer);
  }
  return len._4_4_;
}

Assistant:

CURLcode Curl_ssl_peer_init(struct ssl_peer *peer, struct Curl_cfilter *cf,
                            int transport)
{
  const char *ehostname, *edispname;
  CURLcode result = CURLE_OUT_OF_MEMORY;

  /* We expect a clean struct, e.g. called only ONCE */
  DEBUGASSERT(peer);
  DEBUGASSERT(!peer->hostname);
  DEBUGASSERT(!peer->dispname);
  DEBUGASSERT(!peer->sni);
  /* We need the hostname for SNI negotiation. Once handshaked, this remains
   * the SNI hostname for the TLS connection. When the connection is reused,
   * the settings in cf->conn might change. We keep a copy of the hostname we
   * use for SNI.
   */
  peer->transport = transport;
#ifndef CURL_DISABLE_PROXY
  if(Curl_ssl_cf_is_proxy(cf)) {
    ehostname = cf->conn->http_proxy.host.name;
    edispname = cf->conn->http_proxy.host.dispname;
    peer->port = cf->conn->http_proxy.port;
  }
  else
#endif
  {
    ehostname = cf->conn->host.name;
    edispname = cf->conn->host.dispname;
    peer->port = cf->conn->remote_port;
  }

  /* hostname MUST exist and not be empty */
  if(!ehostname || !ehostname[0]) {
    result = CURLE_FAILED_INIT;
    goto out;
  }

  peer->hostname = strdup(ehostname);
  if(!peer->hostname)
    goto out;
  if(!edispname || !strcmp(ehostname, edispname))
    peer->dispname = peer->hostname;
  else {
    peer->dispname = strdup(edispname);
    if(!peer->dispname)
      goto out;
  }
  peer->type = get_peer_type(peer->hostname);
  if(peer->type == CURL_SSL_PEER_DNS) {
    /* not an IP address, normalize according to RCC 6066 ch. 3,
     * max len of SNI is 2^16-1, no trailing dot */
    size_t len = strlen(peer->hostname);
    if(len && (peer->hostname[len-1] == '.'))
      len--;
    if(len < USHRT_MAX) {
      peer->sni = calloc(1, len + 1);
      if(!peer->sni)
        goto out;
      Curl_strntolower(peer->sni, peer->hostname, len);
      peer->sni[len] = 0;
    }
  }
  result = CURLE_OK;

out:
  if(result)
    Curl_ssl_peer_cleanup(peer);
  return result;
}